

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

int __thiscall
Js::FunctionBody::GetStatementIndexFromNativeOffset
          (FunctionBody *this,SmallSpanSequence *pThrowSpanSequence,uint32 nativeOffset)

{
  BOOL BVar1;
  StatementData local_38;
  StatementData tmpData;
  SmallSpanSequenceIter iter;
  int statementIndex;
  uint32 nativeOffset_local;
  SmallSpanSequence *pThrowSpanSequence_local;
  FunctionBody *this_local;
  
  iter.accumulatedBytecodeBegin = -1;
  if (pThrowSpanSequence != (SmallSpanSequence *)0x0) {
    SmallSpanSequenceIter::SmallSpanSequenceIter((SmallSpanSequenceIter *)&tmpData);
    StatementData::StatementData(&local_38);
    BVar1 = SmallSpanSequence::GetMatchingStatementFromBytecode
                      (pThrowSpanSequence,nativeOffset,(SmallSpanSequenceIter *)&tmpData,&local_38);
    if (BVar1 == 0) {
      iter.accumulatedBytecodeBegin = tmpData.bytecodeBegin;
    }
    else {
      iter.accumulatedBytecodeBegin = local_38.sourceBegin;
    }
  }
  return iter.accumulatedBytecodeBegin;
}

Assistant:

int FunctionBody::GetStatementIndexFromNativeOffset(SmallSpanSequence *pThrowSpanSequence, uint32 nativeOffset)
    {
        int statementIndex = -1;
        if (pThrowSpanSequence)
        {
            SmallSpanSequenceIter iter;
            StatementData tmpData;
            if (pThrowSpanSequence->GetMatchingStatementFromBytecode(nativeOffset, iter, tmpData))
            {
                statementIndex = tmpData.sourceBegin; // sourceBegin represents statementIndex here
            }
            else
            {
                // If nativeOffset falls on the last span, GetMatchingStatement would miss it because SmallSpanSequence
                // does not know about the last span end. Since we checked that codeAddress is within our range,
                // we can safely consider it matches the last span.
                statementIndex = iter.accumulatedSourceBegin;
            }
        }

        return statementIndex;
    }